

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicgstab.h
# Opt level: O1

int BiCGSTAB<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,int64_t *max_iter,double *tol,
              TPZFMatrix<long_double> *residual,int FromCurrent)

{
  bool bVar1;
  TPZFMatrix<long_double> *this;
  int iVar2;
  TPZFMatrix<long_double> *__return_storage_ptr__;
  long lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar7;
  longdouble in_ST7;
  ulong uVar8;
  double dVar9;
  TPZFMatrix<long_double> omega;
  TPZFMatrix<long_double> alpha;
  TPZFMatrix<long_double> rho_1;
  TPZFMatrix<long_double> rho_2;
  TPZFMatrix<long_double> beta;
  TPZFMatrix<long_double> rtilde;
  double local_a48;
  TPZFMatrix<long_double> local_9c0;
  TPZFMatrix<long_double> local_930;
  TPZFMatrix<long_double> local_8a0;
  TPZFMatrix<long_double> local_810;
  TPZFMatrix<long_double> local_780;
  TPZFMatrix<long_double> local_6f0;
  TPZFMatrix<long_double> local_660;
  TPZFMatrix<long_double> local_5d0;
  TPZFMatrix<long_double> local_540;
  TPZFMatrix<long_double> local_4b0;
  TPZFMatrix<long_double> local_420;
  TPZFMatrix<long_double> local_390;
  TPZFMatrix<long_double> local_300;
  TPZFMatrix<long_double> local_270;
  TPZFMatrix<long_double> local_1e0;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> local_c0;
  
  local_8a0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_8a0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_8a0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_8a0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_8a0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_8a0.fElem = (longdouble *)0x0;
  local_8a0.fGiven = (longdouble *)0x0;
  local_8a0.fSize = 0;
  TPZVec<int>::TPZVec(&local_8a0.fPivot.super_TPZVec<int>,0);
  local_8a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_8a0.fPivot.super_TPZVec<int>.fStore = local_8a0.fPivot.fExtAlloc;
  local_8a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_8a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_8a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_8a0.fWork.fStore = (longdouble *)0x0;
  local_8a0.fWork.fNElements = 0;
  local_8a0.fWork.fNAlloc = 0;
  local_8a0.fElem = (longdouble *)operator_new__(0x10);
  local_810.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_810.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_810.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_810.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_810.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_810.fElem = (longdouble *)0x0;
  local_810.fGiven = (longdouble *)0x0;
  local_810.fSize = 0;
  TPZVec<int>::TPZVec(&local_810.fPivot.super_TPZVec<int>,0);
  local_810.fPivot.super_TPZVec<int>.fStore = local_810.fPivot.fExtAlloc;
  local_810.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_810.fPivot.super_TPZVec<int>.fNElements = 0;
  local_810.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_810.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_810.fWork.fStore = (longdouble *)0x0;
  local_810.fWork.fNElements = 0;
  local_810.fWork.fNAlloc = 0;
  local_810.fElem = (longdouble *)operator_new__(0x10);
  local_930.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_930.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_930.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_930.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_930.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_930.fElem = (longdouble *)0x0;
  local_930.fGiven = (longdouble *)0x0;
  local_930.fSize = 0;
  TPZVec<int>::TPZVec(&local_930.fPivot.super_TPZVec<int>,0);
  local_930.fPivot.super_TPZVec<int>.fStore = local_930.fPivot.fExtAlloc;
  local_930.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_930.fPivot.super_TPZVec<int>.fNElements = 0;
  local_930.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_930.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_930.fWork.fStore = (longdouble *)0x0;
  local_930.fWork.fNElements = 0;
  local_930.fWork.fNAlloc = 0;
  local_930.fElem = (longdouble *)operator_new__(0x10);
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_780.fElem = (longdouble *)0x0;
  local_780.fGiven = (longdouble *)0x0;
  local_780.fSize = 0;
  TPZVec<int>::TPZVec(&local_780.fPivot.super_TPZVec<int>,0);
  local_780.fPivot.super_TPZVec<int>.fStore = local_780.fPivot.fExtAlloc;
  local_780.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_780.fPivot.super_TPZVec<int>.fNElements = 0;
  local_780.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_780.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_780.fWork.fStore = (longdouble *)0x0;
  local_780.fWork.fNElements = 0;
  local_780.fWork.fNAlloc = 0;
  local_780.fElem = (longdouble *)operator_new__(0x10);
  local_9c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_9c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_9c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_9c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_9c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_9c0.fElem = (longdouble *)0x0;
  local_9c0.fGiven = (longdouble *)0x0;
  local_9c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_9c0.fPivot.super_TPZVec<int>,0);
  local_9c0.fPivot.super_TPZVec<int>.fStore = local_9c0.fPivot.fExtAlloc;
  local_9c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_9c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_9c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_9c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_9c0.fWork.fStore = (longdouble *)0x0;
  local_9c0.fWork.fNElements = 0;
  local_9c0.fWork.fNAlloc = 0;
  local_9c0.fElem = (longdouble *)operator_new__(0x10);
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_420.fElem = (longdouble *)0x0;
  local_420.fGiven = (longdouble *)0x0;
  local_420.fSize = 0;
  TPZVec<int>::TPZVec(&local_420.fPivot.super_TPZVec<int>,0);
  local_420.fPivot.super_TPZVec<int>.fStore = local_420.fPivot.fExtAlloc;
  local_420.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_420.fPivot.super_TPZVec<int>.fNElements = 0;
  local_420.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_420.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_420.fWork.fStore = (longdouble *)0x0;
  local_420.fWork.fNElements = 0;
  local_420.fWork.fNAlloc = 0;
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_4b0.fElem = (longdouble *)0x0;
  local_4b0.fGiven = (longdouble *)0x0;
  local_4b0.fSize = 0;
  TPZVec<int>::TPZVec(&local_4b0.fPivot.super_TPZVec<int>,0);
  local_4b0.fPivot.super_TPZVec<int>.fStore = local_4b0.fPivot.fExtAlloc;
  local_4b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_4b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_4b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_4b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_4b0.fWork.fStore = (longdouble *)0x0;
  local_4b0.fWork.fNElements = 0;
  local_4b0.fWork.fNAlloc = 0;
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_540.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_540.fElem = (longdouble *)0x0;
  local_540.fGiven = (longdouble *)0x0;
  local_540.fSize = 0;
  TPZVec<int>::TPZVec(&local_540.fPivot.super_TPZVec<int>,0);
  local_540.fPivot.super_TPZVec<int>.fStore = local_540.fPivot.fExtAlloc;
  local_540.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_540.fPivot.super_TPZVec<int>.fNElements = 0;
  local_540.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_540.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_540.fWork.fStore = (longdouble *)0x0;
  local_540.fWork.fNElements = 0;
  local_540.fWork.fNAlloc = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_390.fElem = (longdouble *)0x0;
  local_390.fGiven = (longdouble *)0x0;
  local_390.fSize = 0;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_390.fWork.fStore = (longdouble *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_5d0.fElem = (longdouble *)0x0;
  local_5d0.fGiven = (longdouble *)0x0;
  local_5d0.fSize = 0;
  TPZVec<int>::TPZVec(&local_5d0.fPivot.super_TPZVec<int>,0);
  local_5d0.fPivot.super_TPZVec<int>.fStore = local_5d0.fPivot.fExtAlloc;
  local_5d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_5d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_5d0.fWork.fStore = (longdouble *)0x0;
  local_5d0.fWork.fNElements = 0;
  local_5d0.fWork.fNAlloc = 0;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_660.fElem = (longdouble *)0x0;
  local_660.fGiven = (longdouble *)0x0;
  local_660.fSize = 0;
  TPZVec<int>::TPZVec(&local_660.fPivot.super_TPZVec<int>,0);
  local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
  local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_660.fPivot.super_TPZVec<int>.fNElements = 0;
  local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_660.fWork.fStore = (longdouble *)0x0;
  local_660.fWork.fNElements = 0;
  local_660.fWork.fNAlloc = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_150.fElem = (longdouble *)0x0;
  local_150.fGiven = (longdouble *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_150.fWork.fStore = (longdouble *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  this = &local_150;
  if (residual != (TPZFMatrix<long_double> *)0x0) {
    this = residual;
  }
  Dot<long_double>(b,b);
  lVar4 = in_ST7;
  sqrtl();
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<long_double>::operator=(this,b);
  }
  else {
    lVar4 = in_ST7;
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,this,0);
  }
  lVar6 = lVar4;
  TPZFMatrix<long_double>::TPZFMatrix(&local_1e0,this);
  Dot<long_double>(this,this);
  uVar8 = -(ulong)((double)in_ST1 == 0.0);
  dVar9 = (double)(~uVar8 & (ulong)(double)in_ST1 | uVar8 & 0x3ff0000000000000);
  lVar7 = lVar6;
  sqrtl();
  local_a48 = (double)in_ST3;
  if (*tol <= local_a48 / dVar9) {
    bVar1 = *max_iter < 1;
    __return_storage_ptr__ = (TPZFMatrix<long_double> *)tol;
    if (0 < *max_iter) {
      lVar3 = 0;
      do {
        Dot<long_double>(&local_1e0,this);
        *local_8a0.fElem = in_ST4;
        if (((double)in_ST4 == 0.0) && (!NAN((double)in_ST4))) {
          Dot<long_double>(this,this);
          sqrtl();
          *tol = (double)in_ST6 / dVar9;
          __return_storage_ptr__ = (TPZFMatrix<long_double> *)0x2;
          break;
        }
        if (lVar3 == 0) {
          TPZFMatrix<long_double>::operator=(&local_420,this);
          lVar5 = lVar7;
        }
        else {
          *local_780.fElem = (*local_930.fElem / *local_9c0.fElem) * (in_ST4 / *local_810.fElem);
          lVar7 = *local_780.fElem;
          __return_storage_ptr__ = &local_c0;
          lVar5 = lVar6;
          TPZFMatrix<long_double>::operator*(__return_storage_ptr__,&local_660,*local_9c0.fElem);
          TPZFMatrix<long_double>::operator-(&local_300,&local_420,__return_storage_ptr__);
          TPZFMatrix<long_double>::operator*(&local_270,&local_300,lVar7);
          TPZFMatrix<long_double>::operator+(&local_6f0,this,&local_270);
          TPZFMatrix<long_double>::operator=(&local_420,&local_6f0);
          TPZFMatrix<long_double>::~TPZFMatrix(&local_6f0);
          TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
          TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
          TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
        }
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_420,&local_4b0,0);
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&local_4b0,&local_660)
        ;
        lVar7 = *local_8a0.fElem;
        Dot<long_double>(&local_1e0,&local_660);
        *local_930.fElem = lVar7 / in_ST5;
        in_ST4 = lVar5;
        in_ST5 = lVar5;
        TPZFMatrix<long_double>::operator*(&local_270,&local_660,*local_930.fElem);
        TPZFMatrix<long_double>::operator-(&local_6f0,this,&local_270);
        TPZFMatrix<long_double>::operator=(&local_540,&local_6f0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_6f0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
        Dot<long_double>(this,this);
        in_ST6 = in_ST5;
        sqrtl();
        local_a48 = (double)in_ST7;
        if (local_a48 / dVar9 < *tol) {
          TPZFMatrix<long_double>::operator*(&local_6f0,&local_4b0,*local_930.fElem);
          TPZFMatrix<long_double>::operator+=(x,&local_6f0.super_TPZMatrix<long_double>);
          TPZFMatrix<long_double>::~TPZFMatrix(&local_6f0);
          *tol = local_a48;
LAB_00c50538:
          __return_storage_ptr__ = (TPZFMatrix<long_double> *)0x0;
          break;
        }
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_540,&local_390);
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&local_390,&local_5d0)
        ;
        in_ST7 = in_ST6;
        Dot<long_double>(&local_5d0,&local_540);
        Dot<long_double>(&local_5d0,&local_5d0);
        lVar6 = lVar4 / lVar6;
        lVar4 = in_ST7;
        TPZFMatrix<long_double>::operator=(&local_9c0,lVar6);
        TPZFMatrix<long_double>::operator*(&local_270,&local_4b0,*local_930.fElem);
        TPZFMatrix<long_double>::operator*(&local_300,&local_390,*local_9c0.fElem);
        TPZFMatrix<long_double>::operator+(&local_6f0,&local_270,&local_300);
        TPZFMatrix<long_double>::operator+=(x,&local_6f0.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_6f0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
        TPZFMatrix<long_double>::operator*(&local_270,&local_5d0,*local_9c0.fElem);
        TPZFMatrix<long_double>::operator-(&local_6f0,&local_540,&local_270);
        TPZFMatrix<long_double>::operator=(this,&local_6f0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_6f0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
        *local_810.fElem = *local_8a0.fElem;
        lVar6 = lVar4;
        Dot<long_double>(this,this);
        lVar7 = lVar6;
        sqrtl();
        local_a48 = (double)lVar5;
        if (local_a48 / dVar9 < *tol) {
          *tol = local_a48;
          *max_iter = lVar3 + 1;
          goto LAB_00c50538;
        }
        if (((double)*local_9c0.fElem == 0.0) && (!NAN((double)*local_9c0.fElem))) {
          Dot<long_double>(this,this);
          sqrtl();
          *tol = (double)in_ST5 / dVar9;
          __return_storage_ptr__ = (TPZFMatrix<long_double> *)0x3;
          break;
        }
        lVar3 = lVar3 + 1;
        bVar1 = *max_iter <= lVar3;
      } while (lVar3 < *max_iter);
    }
    iVar2 = (int)__return_storage_ptr__;
    if (bVar1) {
      *tol = local_a48;
      iVar2 = 1;
    }
  }
  else {
    *tol = local_a48;
    *max_iter = 0;
    iVar2 = 0;
  }
  TPZFMatrix<long_double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_660);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_5d0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_540);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_4b0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_420);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_9c0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_780);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_930);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_810);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_8a0);
  return iVar2;
}

Assistant:

int 
BiCGSTAB(const Matrix &A, Vector &x, const Vector &b,
         /*const */Preconditioner &M, int64_t &max_iter, Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1), omega(1);
	Vector p, phat, s, shat, t, v;
	
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
	
	Real normb = TPZExtractVal::val(Norm(b));
	if(FromCurrent) A.MultAdd(x,b,r,-1.,1.);
	else {
		x.Zero();
		r = b;
	}
	
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		rho_1(0) = Dot(rtilde, r);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = TPZExtractVal::val(Norm(r)) / normb;
			return 2;
		}
		if (i == 1)
			p = r;
		else {
			beta(0) = (rho_1(0)/rho_2(0)) * (alpha(0)/omega(0));
			p = r + beta(0) * (p - omega(0) * v);
		}
		
		M.Solve(p, phat);
		A.Multiply(phat, v);
		alpha(0) = rho_1(0) / Dot(rtilde, v);
		s = r - alpha(0) * v;
		if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
			x += alpha(0) * phat;
			tol = resid;
			return 0;
		}
		M.Solve(s, shat);
		A.Multiply(shat, t);
		omega = Dot(t,s) / Dot(t,t);
		x += alpha(0) * phat + omega(0) * shat;
		r = s - omega(0) * t;
		
		rho_2(0) = rho_1(0);
		if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
		if (TPZExtractVal::val(omega(0)) == ((Real)0.)) {
			tol = TPZExtractVal::val(Norm(r)) / normb;
			return 3;
		}
	}
	
	tol = resid;
	return 1;
}